

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compiler.cpp
# Opt level: O1

void __thiscall
GdlSetAttrItem::RhsPrettyPrint
          (GdlSetAttrItem *this,GrcManager *pcman,GdlRule *prule,int irit,ostream *strmOut,bool fXml
          )

{
  string local_50;
  
  GrcSymbolTableEntry::FullAbbrev_abi_cxx11_(&local_50,(this->super_GdlRuleItem).m_psymInput);
  std::__ostream_insert<char,std::char_traits<char>>
            (strmOut,local_50._M_dataplus._M_p,local_50._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  (*(this->super_GdlRuleItem)._vptr_GdlRuleItem[0x27])
            (this,pcman,prule,(ulong)(uint)irit,strmOut,(ulong)fXml);
  std::__ostream_insert<char,std::char_traits<char>>(strmOut,"  ",2);
  return;
}

Assistant:

void GdlSetAttrItem::RhsPrettyPrint(GrcManager * pcman, GdlRule * prule, int irit,
	std::ostream & strmOut, bool fXml)
{
	strmOut << m_psymInput->FullAbbrev();
	AttrSetterPrettyPrint(pcman, prule, irit, strmOut, fXml);
	strmOut << "  ";
}